

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_parser.cpp
# Opt level: O2

Token * __thiscall clickhouse::TypeParser::NextToken(Token *__return_storage_ptr__,TypeParser *this)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  size_t sVar4;
  byte *pbVar5;
  int iVar6;
  byte *pbVar7;
  size_t sVar8;
  
  pbVar7 = (byte *)this->cur_;
  pbVar2 = (byte *)this->end_;
  while (pbVar7 < pbVar2) {
    bVar1 = *pbVar7;
    if (((1 < bVar1 - 9) && (bVar1 != 0)) && (bVar1 != 0x20)) {
      switch(bVar1) {
      case 0x27:
        pbVar7 = pbVar7 + 1;
        sVar4 = 0;
        pbVar5 = pbVar7;
        goto LAB_0015ff1d;
      case 0x28:
        __return_storage_ptr__->type = LPar;
        break;
      case 0x29:
        __return_storage_ptr__->type = RPar;
        break;
      case 0x2a:
      case 0x2b:
switchD_0015ff13_caseD_2a:
        iVar3 = isalpha((int)(char)bVar1);
        if ((bVar1 == 0x5f) || (iVar3 != 0)) {
          sVar8 = 0;
          goto LAB_00160005;
        }
        if (bVar1 != 0x2d && 9 < (int)(char)bVar1 - 0x30U) goto LAB_0015ffe5;
        sVar8 = 1;
        goto LAB_0015ffc0;
      case 0x2c:
        __return_storage_ptr__->type = Comma;
        break;
      default:
        if (bVar1 != 0x3d) goto switchD_0015ff13_caseD_2a;
        __return_storage_ptr__->type = Assign;
      }
      this->cur_ = (char *)(pbVar7 + 1);
      (__return_storage_ptr__->value)._M_len = 1;
      goto LAB_0015ff7c;
    }
    pbVar7 = pbVar7 + 1;
    this->cur_ = (char *)pbVar7;
  }
  __return_storage_ptr__->type = EOS;
LAB_0015ff40:
  (__return_storage_ptr__->value)._M_len = 0;
  (__return_storage_ptr__->value)._M_str = (char *)0x0;
  return __return_storage_ptr__;
LAB_00160005:
  if (pbVar2 <= pbVar7 + sVar8) goto LAB_00160038;
  iVar6 = (int)(char)pbVar7[sVar8];
  iVar3 = isalpha(iVar6);
  if (((iVar6 != 0x5f) && (iVar3 == 0)) && (9 < iVar6 - 0x30U)) goto LAB_00160038;
  this->cur_ = (char *)(pbVar7 + sVar8 + 1);
  sVar8 = sVar8 + 1;
  goto LAB_00160005;
LAB_00160038:
  __return_storage_ptr__->type = Name;
  (__return_storage_ptr__->value)._M_len = sVar8;
  goto LAB_0015ff7c;
LAB_0015ff1d:
  this->cur_ = (char *)pbVar5;
  if (pbVar2 <= pbVar5) goto LAB_0015ffe5;
  if (*pbVar5 == 0x27) {
    __return_storage_ptr__->type = String;
    this->cur_ = (char *)(pbVar5 + 1);
    goto LAB_0015fff9;
  }
  pbVar5 = pbVar5 + 1;
  sVar4 = sVar4 + 1;
  goto LAB_0015ff1d;
LAB_0015ffe5:
  __return_storage_ptr__->type = Invalid;
  goto LAB_0015ff40;
  while (sVar8 = sVar4 + 1, (int)(char)*pbVar5 - 0x30U < 10) {
LAB_0015ffc0:
    sVar4 = sVar8;
    pbVar5 = pbVar7 + sVar4;
    this->cur_ = (char *)pbVar5;
    if (pbVar2 <= pbVar5) break;
  }
  __return_storage_ptr__->type = Number;
LAB_0015fff9:
  (__return_storage_ptr__->value)._M_len = sVar4;
LAB_0015ff7c:
  (__return_storage_ptr__->value)._M_str = (char *)pbVar7;
  return __return_storage_ptr__;
}

Assistant:

TypeParser::Token TypeParser::NextToken() {
    for (; cur_ < end_; ++cur_) {
        switch (*cur_) {
            case ' ':
            case '\n':
            case '\t':
            case '\0':
                continue;

            case '=':
                return Token{Token::Assign, std::string_view(cur_++, 1)};
            case '(':
                return Token{Token::LPar, std::string_view(cur_++, 1)};
            case ')':
                return Token{Token::RPar, std::string_view(cur_++, 1)};
            case ',':
                return Token{Token::Comma, std::string_view(cur_++, 1)};

            default: {
                const char* st = cur_;

                if (*cur_ == '\'') {
                    for (st = ++cur_; cur_ < end_; ++cur_) {
                        if (*cur_ == '\'') {
                            return Token{Token::String, std::string_view(st, cur_++ - st)};
                        }
                    }

                    return Token{Token::Invalid, std::string_view()};
                }

                if (isalpha(*cur_) || *cur_ == '_') {
                    for (; cur_ < end_; ++cur_) {
                        if (!isalpha(*cur_) && !isdigit(*cur_) && *cur_ != '_') {
                            break;
                        }
                    }

                    return Token{Token::Name, std::string_view(st, cur_ - st)};
                }

                if (isdigit(*cur_) || *cur_ == '-') {
                    for (++cur_; cur_ < end_; ++cur_) {
                        if (!isdigit(*cur_)) {
                            break;
                        }
                    }

                    return Token{Token::Number, std::string_view(st, cur_ - st)};
                }

                return Token{Token::Invalid, std::string_view()};
            }
        }
    }

    return Token{Token::EOS, std::string_view()};
}